

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O0

bool __thiscall
cmBuildCommand::MainSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  ostream *poVar6;
  ulong uVar7;
  cmGlobalGenerator *this_00;
  char *value;
  allocator<char> local_2d1;
  string local_2d0;
  undefined1 local_2b0 [8];
  string makecommand;
  string local_288;
  undefined4 local_264;
  string local_260;
  undefined1 local_240 [8];
  ostringstream e;
  uint local_c8;
  int local_c4;
  uint i;
  Doing doing;
  string target;
  string project_name;
  string configuration;
  string *variable;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmBuildCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"requires at least one argument naming a CMake variable",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,0);
    std::__cxx11::string::string((string *)(project_name.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(target.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&i);
    local_c4 = 0;
    for (local_c8 = 1;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_20), local_c8 < sVar4; local_c8 = local_c8 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,(ulong)local_c8);
      bVar2 = std::operator==(pvVar5,"CONFIGURATION");
      if (bVar2) {
        local_c4 = 1;
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,(ulong)local_c8);
        bVar2 = std::operator==(pvVar5,"PROJECT_NAME");
        if (bVar2) {
          local_c4 = 2;
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,(ulong)local_c8);
          bVar2 = std::operator==(pvVar5,"TARGET");
          if (bVar2) {
            local_c4 = 3;
          }
          else {
            if (local_c4 == 1) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_20,(ulong)local_c8);
              std::__cxx11::string::operator=
                        ((string *)(project_name.field_2._M_local_buf + 8),(string *)pvVar5);
            }
            else if (local_c4 == 2) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_20,(ulong)local_c8);
              std::__cxx11::string::operator=
                        ((string *)(target.field_2._M_local_buf + 8),(string *)pvVar5);
            }
            else {
              if (local_c4 != 3) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                poVar6 = std::operator<<((ostream *)local_240,"unknown argument \"");
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](local_20,(ulong)local_c8);
                poVar6 = std::operator<<(poVar6,(string *)pvVar3);
                std::operator<<(poVar6,"\"");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_260);
                std::__cxx11::string::~string((string *)&local_260);
                this_local._7_1_ = 0;
                local_264 = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
                goto LAB_00224a3a;
              }
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_20,(ulong)local_c8);
              std::__cxx11::string::operator=((string *)&i,(string *)pvVar5);
            }
            local_c4 = 0;
          }
        }
      }
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",(string *)((long)&project_name.field_2 + 8));
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      std::__cxx11::string::operator=((string *)(project_name.field_2._M_local_buf + 8),"Release");
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_288,"Ignoring PROJECT_NAME option because it has no effect.",
                 (allocator<char> *)(makecommand.field_2._M_local_buf + 0xf));
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)(makecommand.field_2._M_local_buf + 0xf));
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"",&local_2d1);
    bVar2 = cmMakefile::IgnoreErrorsCMP0061((this->super_cmCommand).Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_2b0,this_00,(string *)&i,(string *)((long)&project_name.field_2 + 8),
               &local_2d0,bVar2);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    pcVar1 = (this->super_cmCommand).Makefile;
    value = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,pvVar3,value);
    this_local._7_1_ = 1;
    local_264 = 1;
    std::__cxx11::string::~string((string *)local_2b0);
LAB_00224a3a:
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)(target.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(project_name.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBuildCommand::MainSignature(std::vector<std::string> const& args)
{
  if (args.empty()) {
    this->SetError("requires at least one argument naming a CMake variable");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  // Parse remaining arguments.
  std::string configuration;
  std::string project_name;
  std::string target;
  enum Doing
  {
    DoingNone,
    DoingConfiguration,
    DoingProjectName,
    DoingTarget
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "CONFIGURATION") {
      doing = DoingConfiguration;
    } else if (args[i] == "PROJECT_NAME") {
      doing = DoingProjectName;
    } else if (args[i] == "TARGET") {
      doing = DoingTarget;
    } else if (doing == DoingConfiguration) {
      doing = DoingNone;
      configuration = args[i];
    } else if (doing == DoingProjectName) {
      doing = DoingNone;
      project_name = args[i];
    } else if (doing == DoingTarget) {
      doing = DoingNone;
      target = args[i];
    } else {
      std::ostringstream e;
      e << "unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
    }
  }

  // If null/empty CONFIGURATION argument, cmake --build uses 'Debug'
  // in the currently implemented multi-configuration global generators...
  // so we put this code here to end up with the same default configuration
  // as the original 2-arg build_command signature:
  //
  if (configuration.empty()) {
    cmSystemTools::GetEnv("CMAKE_CONFIG_TYPE", configuration);
  }
  if (configuration.empty()) {
    configuration = "Release";
  }

  if (!project_name.empty()) {
    this->Makefile->IssueMessage(
      MessageType::AUTHOR_WARNING,
      "Ignoring PROJECT_NAME option because it has no effect.");
  }

  std::string makecommand =
    this->Makefile->GetGlobalGenerator()->GenerateCMakeBuildCommand(
      target, configuration, "", this->Makefile->IgnoreErrorsCMP0061());

  this->Makefile->AddDefinition(variable, makecommand.c_str());

  return true;
}